

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>
opts::Option<unsigned_int>(char s,string *l,uint *var,string *help)

{
  tuple<opts::BasicOption_*,_std::default_delete<opts::BasicOption>_> in_RDI;
  string *in_stack_00000008;
  string *in_stack_00000010;
  uint *in_stack_00000018;
  string *in_stack_00000020;
  char in_stack_0000002f;
  OptionContainer<unsigned_int> *in_stack_00000030;
  pointer in_stack_ffffffffffffff68;
  _Head_base<0UL,_opts::BasicOption_*,_false> this;
  string local_48 [72];
  
  this._M_head_impl =
       (BasicOption *)
       in_RDI.super__Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>.
       super__Head_base<0UL,_opts::BasicOption_*,_false>._M_head_impl;
  operator_new(0x98);
  Traits<unsigned_int>::type_string_abi_cxx11_();
  OptionContainer<unsigned_int>::OptionContainer
            (in_stack_00000030,in_stack_0000002f,in_stack_00000020,in_stack_00000018,
             in_stack_00000010,in_stack_00000008);
  std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>::
  unique_ptr<std::default_delete<opts::BasicOption>,void>
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             this._M_head_impl,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_48);
  return (__uniq_ptr_data<opts::BasicOption,_std::default_delete<opts::BasicOption>,_true,_true>)
         (__uniq_ptr_data<opts::BasicOption,_std::default_delete<opts::BasicOption>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>
         .super__Head_base<0UL,_opts::BasicOption_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<BasicOption>
Option(char s, const std::string& l, T& var, const std::string& help)       { return std::unique_ptr<BasicOption>{new OptionContainer<T>(s, l, var, help)}; }